

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall capnp::compiler::NodeTranslator::~NodeTranslator(NodeTranslator *this)

{
  UnfinishedValue *pUVar1;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar2;
  UnfinishedValue *pUVar3;
  ArrayDisposer *pAVar4;
  AuxNode *pAVar5;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRVar6;
  AuxNode *pAVar7;
  BrandScope *pBVar8;
  Disposer *pDVar9;
  
  pUVar1 = (this->unfinishedValues).builder.ptr;
  if (pUVar1 != (UnfinishedValue *)0x0) {
    pRVar2 = (this->unfinishedValues).builder.pos;
    pUVar3 = (this->unfinishedValues).builder.endPtr;
    (this->unfinishedValues).builder.ptr = (UnfinishedValue *)0x0;
    (this->unfinishedValues).builder.pos =
         (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)0x0;
    (this->unfinishedValues).builder.endPtr = (UnfinishedValue *)0x0;
    pAVar4 = (this->unfinishedValues).builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pUVar1,0x98,((long)pRVar2 - (long)pUVar1 >> 3) * -0x79435e50d79435e5,
               ((long)pUVar3 - (long)pUVar1 >> 3) * -0x79435e50d79435e5,
               kj::ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::UnfinishedValue>::
               destruct);
  }
  pAVar5 = (this->paramStructs).builder.ptr;
  if (pAVar5 != (AuxNode *)0x0) {
    pRVar6 = (this->paramStructs).builder.pos;
    pAVar7 = (this->paramStructs).builder.endPtr;
    (this->paramStructs).builder.ptr = (AuxNode *)0x0;
    (this->paramStructs).builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
    (this->paramStructs).builder.endPtr = (AuxNode *)0x0;
    pAVar4 = (this->paramStructs).builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pAVar5,0x40,(long)pRVar6 - (long)pAVar5 >> 6,(long)pAVar7 - (long)pAVar5 >> 6,
               kj::ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::AuxNode>::destruct);
  }
  pAVar5 = (this->groups).builder.ptr;
  if (pAVar5 != (AuxNode *)0x0) {
    pRVar6 = (this->groups).builder.pos;
    pAVar7 = (this->groups).builder.endPtr;
    (this->groups).builder.ptr = (AuxNode *)0x0;
    (this->groups).builder.pos = (RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *)0x0;
    (this->groups).builder.endPtr = (AuxNode *)0x0;
    pAVar4 = (this->groups).builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pAVar5,0x40,(long)pRVar6 - (long)pAVar5 >> 6,(long)pAVar7 - (long)pAVar5 >> 6,
               kj::ArrayDisposer::Dispose_<capnp::compiler::NodeTranslator::AuxNode>::destruct);
  }
  if ((this->sourceInfo).builder.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&(this->sourceInfo).builder);
  }
  if ((this->wipNode).builder.segment != (SegmentBuilder *)0x0) {
    capnp::_::OrphanBuilder::euthanize(&(this->wipNode).builder);
  }
  pBVar8 = (this->localBrand).ptr;
  if (pBVar8 != (BrandScope *)0x0) {
    (this->localBrand).ptr = (BrandScope *)0x0;
    pDVar9 = (this->localBrand).disposer;
    (**pDVar9->_vptr_Disposer)
              (pDVar9,(pBVar8->super_Refcounted).super_Disposer._vptr_Disposer[-2] +
                      (long)&(pBVar8->super_Refcounted).super_Disposer._vptr_Disposer);
    return;
  }
  return;
}

Assistant:

NodeTranslator::~NodeTranslator() noexcept(false) {}